

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O2

int main(void)

{
  allocator local_10a;
  allocator local_109;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  shared_ptr<Liby::TcpServer> echo_server;
  allocator local_d8 [32];
  undefined1 local_b8 [16];
  code *local_a8;
  code *local_a0;
  EventLoopGroup group;
  
  std::__cxx11::string::string((string *)local_108._M_pod_data,"EPOLL",local_d8);
  Liby::EventLoopGroup::EventLoopGroup(&group,4,(string *)&local_108);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  std::__cxx11::string::string((string *)local_108._M_pod_data,"localhost",&local_109);
  std::__cxx11::string::string((string *)local_d8,"9377",&local_10a);
  Liby::EventLoopGroup::creatTcpServer
            ((EventLoopGroup *)&echo_server,(string *)&group,(string *)&local_108);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo.cpp:6:25)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo.cpp:6:25)>
             ::_M_manager;
  std::function<void_(Liby::Connection_&)>::operator=
            (&(echo_server.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
             ::_M_manager;
  Liby::EventLoopGroup::run(&group,(BoolFunctor *)local_b8);
  std::_Function_base::~_Function_base((_Function_base *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&echo_server.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Liby::EventLoopGroup::~EventLoopGroup(&group);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group(4, "EPOLL");
    auto echo_server = group.creatTcpServer("localhost", "9377");
    echo_server->onRead([](Connection &conn) { conn.send(conn.read()); });
    group.run();
    return 0;
}